

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void getDirectoryPart(char *fullpath,uint length,uint *newLength)

{
  bool bVar1;
  uint local_30;
  char *local_28;
  char *iter;
  uint *newLength_local;
  uint length_local;
  char *fullpath_local;
  
  if (newLength != (uint *)0x0) {
    if ((fullpath == (char *)0x0) || (length == 0)) {
      *newLength = 0;
    }
    else {
      local_28 = fullpath + length;
      do {
        local_28 = local_28 + -1;
        bVar1 = false;
        if ((fullpath < local_28) && (bVar1 = false, *local_28 != '/')) {
          bVar1 = *local_28 != '\\';
        }
      } while (bVar1);
      local_30 = length;
      if (fullpath < local_28) {
        local_30 = (int)local_28 - (int)fullpath;
      }
      *newLength = local_30;
    }
  }
  return;
}

Assistant:

void getDirectoryPart(const char * fullpath, unsigned int length, unsigned int * newLength)
{
    if (newLength == 0x0)
    {
        return;
    }

    if (fullpath == 0x0 || length == 0)
    {
        *newLength = 0;
        return;
    }

    const char * iter = fullpath + length - 1;
    while (iter > fullpath && *iter != unixPathDelim && *iter != windowsPathDelim)
    {
        --iter;
    }

    *newLength = iter > fullpath ? (unsigned int)(iter - fullpath) : length;
}